

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lanli.c
# Opt level: O0

void print_help(char *basename)

{
  flag_info *flag;
  callback_info *callback;
  size_t i;
  char *basename_local;
  
  printf("Usage: %s [OPTION]... [FILE]\n\n",basename);
  printf(
        "Process the HTML in FILE (or standard input), and sanitize it using the Lanli library. The result is written to standard output. Parsing and filtering can be controlled through the options below.\n\n"
        );
  printf("Main options:\n");
  print_option('l',"levels=N",
               "Number of additional levels. Zero disables the feature. Default is 0.");
  print_option('n',"max-nesting=N","Size of the tag nesting stack. Default is 16.");
  print_option('a',"max-attributes=N",
               "Maximum number of attributes accepted in a tag. Default is 8.");
  print_option('T',"time","Show time spent in rendering.");
  print_option('i',"input-unit=N","Reading block size. Default is 1024.");
  print_option('o',"output-unit=N","Writing block size. Default is 64.");
  print_option('h',"help","Print this help text.");
  print_option('v',"version","Print Lanli version.");
  printf("\n");
  printf("Callback selection:\n");
  for (callback = (callback_info *)0x0; callback < (callback_info *)0x6;
      callback = (callback_info *)((long)&callback->callback + 1)) {
    print_option('\0',callbacks_info[(long)callback].option_name,
                 callbacks_info[(long)callback].description);
  }
  printf("\n");
  printf("Flags:\n");
  for (callback = (callback_info *)0x0; callback < (callback_info *)0x4;
      callback = (callback_info *)((long)&callback->callback + 1)) {
    print_option('\0',flags_info[(long)callback].option_name,flags_info[(long)callback].description)
    ;
  }
  printf("\n");
  printf(
        "Flags can be negated by prepending \'no\' to them, as in \'--no-parse-comments\' or \'--no-skip-invalid\'. Options are processed in order, so in case of contradictory options the last specified stands.\n\n"
        );
  printf(
        "When FILE is \'-\', read standard input. If no FILE was given, read standard input. Use \'--\' to signal end of option parsing. Exit status is 0 if no errors occured, 1 with option parsing errors or 5 with I/O errors.\n\n"
        );
  return;
}

Assistant:

static void print_help(const char *basename) {
  size_t i;

  /* usage */
  printf("Usage: %s [OPTION]... [FILE]\n\n", basename);

  /* description */
  printf("Process the HTML in FILE (or standard input), and sanitize it using the Lanli library. "
         "The result is written to standard output. Parsing and filtering can be controlled through the options below.\n\n");

  /* main options */
  printf("Main options:\n");
  print_option('l', "levels=N", "Number of additional levels. Zero disables the feature. Default is " str(DEF_LEVELS) ".");
  print_option('n', "max-nesting=N", "Size of the tag nesting stack. Default is " str(DEF_MAX_NESTING) ".");
  print_option('a', "max-attributes=N", "Maximum number of attributes accepted in a tag. Default is " str(DEF_MAX_ATTRIBUTES) ".");
  print_option('T', "time", "Show time spent in rendering.");
  print_option('i', "input-unit=N", "Reading block size. Default is " str(DEF_IUNIT) ".");
  print_option('o', "output-unit=N", "Writing block size. Default is " str(DEF_OUNIT) ".");
  print_option('h', "help", "Print this help text.");
  print_option('v', "version", "Print Lanli version.");
  printf("\n");

  /* callbacks */
  printf("Callback selection:\n");
  for (i = 0; i < count_of(callbacks_info); i++) {
    struct callback_info *callback = &callbacks_info[i];
    print_option(  0, callback->option_name, callback->description);
  }
  printf("\n");

  /* features */
  printf("Flags:\n");
  for (i = 0; i < count_of(flags_info); i++) {
    struct flag_info *flag = &flags_info[i];
    print_option(  0, flag->option_name, flag->description);
  }
  printf("\n");

  /* ending */
  printf("Flags can be negated by prepending 'no' to them, as in '--no-parse-comments' or '--no-skip-invalid'. "
         "Options are processed in order, so in case of contradictory options the last specified stands.\n\n");

  printf("When FILE is '-', read standard input. If no FILE was given, read standard input. Use '--' to signal end of option parsing. "
         "Exit status is 0 if no errors occured, 1 with option parsing errors or 5 with I/O errors.\n\n");
}